

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatrix.cpp
# Opt level: O0

void __thiscall Bmatrix::clear(Bmatrix *this)

{
  Bmatrix *this_local;
  
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::clear(&this->B);
  this->zNum = 0;
  this->yNum = 0;
  this->xNum = 0;
  return;
}

Assistant:

void Bmatrix::clear() {
    B.clear();
    xNum = yNum = zNum = 0;
}